

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          CappedArray<char,_14UL> *rest,ArrayPtr<const_char> *rest_1,CappedArray<char,_26UL> *rest_2
          ,ArrayPtr<const_char> *rest_3,CappedArray<char,_26UL> *rest_4)

{
  size_t sVar1;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(pos,first->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest->currentSize;
  if (sVar1 != 0) {
    memcpy(pos,rest->content,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest_1->ptr,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_2->currentSize;
  if (sVar1 != 0) {
    memcpy(pos,rest_2->content,sVar1);
    pos = pos + sVar1;
  }
  sVar1 = rest_3->size_;
  if (sVar1 != 0) {
    memcpy(pos,rest_3->ptr,sVar1);
    pos = pos + sVar1;
  }
  if (rest_4->currentSize != 0) {
    memcpy(pos,rest_4->content,rest_4->currentSize);
    return;
  }
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}